

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_pool.cpp
# Opt level: O1

void __thiscall duckdb::EvictionQueue::PurgeIteration(EvictionQueue *this,idx_t purge_size)

{
  size_t sVar1;
  reference element;
  ImplicitProducer *this_00;
  ulong uVar2;
  size_type __n;
  long lVar3;
  shared_ptr<duckdb::BlockHandle,_true> handle;
  element_type *local_40;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  uVar2 = ((long)(this->purge_nodes).
                 super_vector<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>
                 .
                 super__Vector_base<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->purge_nodes).
                 super_vector<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>
                 .
                 super__Vector_base<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (uVar2 < purge_size || purge_size < uVar2 >> 1) {
    ::std::vector<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>::resize
              (&(this->purge_nodes).
                super_vector<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>
               ,purge_size);
  }
  sVar1 = duckdb_moodycamel::
          ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
          ::
          try_dequeue_bulk<__gnu_cxx::__normal_iterator<duckdb::BufferEvictionNode*,std::vector<duckdb::BufferEvictionNode,std::allocator<duckdb::BufferEvictionNode>>>>
                    ((ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
                      *)&this->q,
                     (this->purge_nodes).
                     super_vector<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>
                     .
                     super__Vector_base<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>
                     ._M_impl.super__Vector_impl_data._M_start,purge_size);
  lVar3 = 0;
  if (sVar1 != 0) {
    __n = 0;
    do {
      element = vector<duckdb::BufferEvictionNode,_true>::operator[](&this->purge_nodes,__n);
      BufferEvictionNode::TryGetBlockHandle((BufferEvictionNode *)&local_40);
      if (local_40 != (element_type *)0x0) {
        this_00 = duckdb_moodycamel::
                  ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
                  ::get_or_add_implicit_producer(&this->q);
        if (this_00 != (ImplicitProducer *)0x0) {
          duckdb_moodycamel::
          ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
          ::ImplicitProducer::
          enqueue<(duckdb_moodycamel::ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0,duckdb::BufferEvictionNode>
                    ((ImplicitProducer *)this_00,element);
        }
        lVar3 = lVar3 + 1;
      }
      if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
      }
      __n = __n + 1;
    } while (sVar1 != __n);
  }
  LOCK();
  (this->total_dead_nodes).super___atomic_base<unsigned_long>._M_i =
       (this->total_dead_nodes).super___atomic_base<unsigned_long>._M_i - (sVar1 - lVar3);
  UNLOCK();
  return;
}

Assistant:

void EvictionQueue::PurgeIteration(const idx_t purge_size) {
	// if this purge is significantly smaller or bigger than the previous purge, then
	// we need to resize the purge_nodes vector. Note that this barely happens, as we
	// purge queue_insertions * PURGE_SIZE_MULTIPLIER nodes
	idx_t previous_purge_size = purge_nodes.size();
	if (purge_size < previous_purge_size / 2 || purge_size > previous_purge_size) {
		purge_nodes.resize(purge_size);
	}

	// bulk purge
	idx_t actually_dequeued = q.try_dequeue_bulk(purge_nodes.begin(), purge_size);

	// retrieve all alive nodes that have been wrongly dequeued
	idx_t alive_nodes = 0;
	for (idx_t i = 0; i < actually_dequeued; i++) {
		auto &node = purge_nodes[i];
		auto handle = node.TryGetBlockHandle();
		if (handle) {
			q.enqueue(std::move(node));
			alive_nodes++;
		}
	}

	total_dead_nodes -= actually_dequeued - alive_nodes;
}